

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O2

void pgraph_dump_control(int cnum,pgraph_state *state)

{
  uint uVar1;
  Register *pRVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg;
  pointer puVar6;
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  local_40;
  
  hwtest::pgraph::pgraph_control_regs(&local_40,&state->chipset);
  for (puVar6 = local_40.
                super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar6 != local_40.
                super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
    pRVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
             ._M_t.
             super__Tuple_impl<0UL,_hwtest::pgraph::Register_*,_std::default_delete<hwtest::pgraph::Register>_>
             .super__Head_base<0UL,_hwtest::pgraph::Register_*,_false>._M_head_impl;
    iVar4 = (*pRVar2->_vptr_Register[6])(pRVar2,cnum);
    pRVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
             ._M_t.
             super__Tuple_impl<0UL,_hwtest::pgraph::Register_*,_std::default_delete<hwtest::pgraph::Register>_>
             .super__Head_base<0UL,_hwtest::pgraph::Register_*,_false>._M_head_impl;
    iVar5 = (*pRVar2->_vptr_Register[3])(pRVar2,state);
    *(int *)CONCAT44(extraout_var,iVar5) = iVar4;
  }
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  ::~vector(&local_40);
  uVar1 = (state->chipset).card_type;
  pvVar3 = nva_cards[cnum]->bar0;
  if ((int)uVar1 < 4) {
    state->intr = *(uint *)((long)pvVar3 + 0x400100) & 0xfffffeff;
    state->invalid = *(uint32_t *)((long)pvVar3 + 0x400104);
  }
  else {
    state->intr = *(uint *)((long)pvVar3 + 0x400100);
    state->nsource = *(uint32_t *)((long)pvVar3 + 0x400108);
    if (uVar1 - 0x10 < 0x30) {
      state->state3d = *(uint32_t *)((long)pvVar3 + 0x40077c);
    }
    if (((uVar1 < 0x20) && (iVar4 = (state->chipset).chipset, 0x16 < iVar4)) && (iVar4 != 0x1a)) {
      state->zcull_unka00[0] = *(uint32_t *)((long)pvVar3 + 0x400a00);
      state->zcull_unka00[1] = *(uint32_t *)((long)pvVar3 + 0x400a04);
      state->unka10 = *(uint32_t *)((long)pvVar3 + 0x400a10);
    }
  }
  return;
}

Assistant:

void pgraph_dump_control(int cnum, struct pgraph_state *state) {
	for (auto &reg : pgraph_control_regs(state->chipset)) {
		reg->ref(state) = reg->read(cnum);
	}
	if (state->chipset.card_type < 4) {
		state->intr = nva_rd32(cnum, 0x400100) & ~0x100;
		state->invalid = nva_rd32(cnum, 0x400104);
	} else {
		state->intr = nva_rd32(cnum, 0x400100);
		state->nsource = nva_rd32(cnum, 0x400108);
		if (state->chipset.card_type >= 0x10 && state->chipset.card_type < 0x40)
			state->state3d = nva_rd32(cnum, 0x40077c);
		bool is_nv17p = nv04_pgraph_is_nv17p(&state->chipset);
		if (is_nv17p) {
			state->zcull_unka00[0] = nva_rd32(cnum, 0x400a00);
			state->zcull_unka00[1] = nva_rd32(cnum, 0x400a04);
			state->unka10 = nva_rd32(cnum, 0x400a10);
		}
	}
}